

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

Abc_Obj_t * Ver_ParseCreateLatch(Abc_Ntk_t *pNtk,Abc_Obj_t *pNetLI,Abc_Obj_t *pNetLO)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pObj;
  char *pName;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pNetLO_local;
  Abc_Obj_t *pNetLI_local;
  Abc_Ntk_t *pNtk_local;
  
  pAVar1 = Abc_NtkCreateBi(pNtk);
  Abc_ObjAddFanin(pAVar1,pNetLI);
  pObj = Abc_NtkCreateLatch(pNtk);
  Abc_ObjAddFanin(pObj,pAVar1);
  pAVar1 = Abc_NtkCreateBo(pNtk);
  Abc_ObjAddFanin(pAVar1,pObj);
  Abc_ObjAddFanin(pNetLO,pAVar1);
  pName = Abc_ObjName(pNetLO);
  Abc_ObjAssignName(pObj,pName,"L");
  Abc_LatchSetInitDc(pObj);
  return pObj;
}

Assistant:

Abc_Obj_t * Ver_ParseCreateLatch( Abc_Ntk_t * pNtk, Abc_Obj_t * pNetLI, Abc_Obj_t * pNetLO )
{
    Abc_Obj_t * pLatch, * pTerm;
    // add the BO terminal
    pTerm = Abc_NtkCreateBi( pNtk );
    Abc_ObjAddFanin( pTerm, pNetLI );
    // add the latch box
    pLatch = Abc_NtkCreateLatch( pNtk );
    Abc_ObjAddFanin( pLatch, pTerm  );
    // add the BI terminal
    pTerm = Abc_NtkCreateBo( pNtk );
    Abc_ObjAddFanin( pTerm, pLatch );
    // get the LO net
    Abc_ObjAddFanin( pNetLO, pTerm );
    // set latch name
    Abc_ObjAssignName( pLatch, Abc_ObjName(pNetLO), "L" );
    Abc_LatchSetInitDc( pLatch );
    return pLatch;
}